

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_handshake_message
              (ptls_t *tls,ptls_buffer_t *sendbuf,ptls_iovec_t message,
              ptls_handshake_properties_t *properties)

{
  uint8_t *puVar1;
  anon_struct_16_3_80f1ae39_for_server *paVar2;
  uint8_t uVar3;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var4;
  st_ptls_hash_context_t *psVar5;
  st_ptls_verify_certificate_t *psVar6;
  st_ptls_key_exchange_context_t *psVar7;
  st_ptls_save_ticket_t *psVar8;
  st_ptls_encrypt_ticket_t *psVar9;
  st_ptls_lookup_certificate_t *psVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  ushort uVar15;
  ushort uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ptls_cipher_suite_t **pppVar20;
  ushort *puVar21;
  ulong uVar22;
  ulong uVar23;
  ushort *puVar24;
  st_ptls_key_schedule_t *psVar25;
  st_ptls_early_data_receiver_t *psVar26;
  size_t sVar27;
  size_t sVar28;
  ptls_cipher_suite_t *ppVar29;
  char *pcVar30;
  byte *pbVar31;
  long lVar32;
  ulong uVar33;
  char *context_string;
  uint16_t uVar34;
  ushort *puVar35;
  ushort *puVar36;
  byte *pbVar37;
  ulong uVar38;
  ushort *puVar39;
  st_ptls_client_hello_t *psVar40;
  size_t *psVar41;
  long lVar42;
  void *__ptr;
  uint8_t *puVar43;
  ulong uVar44;
  byte bVar45;
  size_t sVar46;
  size_t sVar47;
  size_t sVar48;
  size_t sVar49;
  anon_enum_32 aVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  ptls_iovec_t salt;
  ptls_iovec_t pVar53;
  ptls_iovec_t salt_00;
  ptls_iovec_t salt_01;
  ptls_iovec_t pVar54;
  ptls_iovec_t salt_02;
  ptls_iovec_t salt_03;
  ptls_iovec_t pVar55;
  ptls_iovec_t salt_04;
  ptls_iovec_t pVar56;
  ptls_iovec_t pVar57;
  ptls_iovec_t ikm;
  ptls_iovec_t ikm_00;
  ptls_iovec_t ikm_01;
  ptls_iovec_t ikm_02;
  ptls_iovec_t ikm_03;
  ptls_iovec_t ikm_04;
  size_t mess_start;
  size_t mess_start_1;
  size_t local_4a0;
  uint16_t sign_algorithm;
  size_t local_490;
  size_t local_488;
  uint16_t ticket_csid;
  size_t local_478;
  byte *local_470;
  char **local_468;
  size_t num_certs;
  ptls_buffer_t decbuf;
  void *signer_data;
  _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t *signer;
  ptls_iovec_t *certs;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  uint32_t age_add;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ticket_psk;
  uint64_t issue_at;
  st_ptls_client_hello_t ch;
  uint8_t binder_key [64];
  uint32_t max_early_data_size;
  uint8_t finished_key [64];
  
  uVar33 = message.len;
  puVar43 = message.base;
  aVar50 = tls->state;
  if (8 < aVar50 - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO) {
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x860,
                  "int handle_handshake_message(ptls_t *, ptls_buffer_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  uVar3 = *puVar43;
  switch(aVar50) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    if (uVar3 != '\x02') {
      return 10;
    }
    ch.compression_methods.ids = (uint8_t *)0x0;
    ch.compression_methods.count = 0;
    if ((long)uVar33 < 6) {
      return 0x32;
    }
    if ((ushort)(*(ushort *)(puVar43 + 4) << 8 | *(ushort *)(puVar43 + 4) >> 8) == 0x7f12) {
      if (uVar33 < 0x28) {
        return 0x32;
      }
      pppVar20 = tls->ctx->cipher_suites;
      ppVar29 = *pppVar20;
      if (ppVar29 != (ptls_cipher_suite_t *)0x0) {
        do {
          pppVar20 = pppVar20 + 1;
          if (ppVar29->id ==
              (uint16_t)(*(ushort *)(puVar43 + 0x26) << 8 | *(ushort *)(puVar43 + 0x26) >> 8)) {
            tls->cipher_suite = ppVar29;
            if ((uVar33 & 0x7ffffffffffffffe) == 0x28) {
              return 0x32;
            }
            uVar22 = (ulong)(ushort)(*(ushort *)(puVar43 + 0x28) << 8 |
                                    *(ushort *)(puVar43 + 0x28) >> 8);
            if (uVar33 - 0x2a < uVar22) {
              return 0x32;
            }
            puVar39 = (ushort *)(puVar43 + uVar22 + 0x2a);
            if (uVar22 != 0) {
              mess_start = 0xffff;
              bVar45 = 0;
              uVar22 = 0;
              puVar35 = (ushort *)0x0;
              puVar21 = (ushort *)(puVar43 + 0x2a);
              do {
                if ((long)puVar39 - (long)puVar21 < 2) {
                  return 0x32;
                }
                uVar16 = *puVar21;
                uVar15 = uVar16 << 8 | uVar16 >> 8;
                uVar18 = (uint)uVar15;
                if (uVar15 < 8) {
                  if ((bVar45 >> (uVar18 & 0x1f) & 1) != 0) {
                    return 0x2f;
                  }
                  bVar45 = (byte)(1 << ((byte)(uVar16 >> 8) & 0x1f)) & 7 | bVar45;
                }
                if ((ulong)((long)puVar39 - (long)(puVar21 + 1)) < 2) {
                  return 0x32;
                }
                uVar16 = puVar21[1] << 8 | puVar21[1] >> 8;
                if ((ulong)((long)puVar39 - (long)(puVar21 + 2)) < (ulong)uVar16) {
                  return 0x32;
                }
                puVar36 = (ushort *)((long)(puVar21 + 2) + (ulong)uVar16);
                if (uVar15 == 0x28) {
                  if (uVar16 < 2) {
                    return 0x32;
                  }
                  if ((char *)((long)puVar36 + (-6 - (long)puVar21)) < (char *)0x2) {
                    return 0x32;
                  }
                  puVar35 = puVar21 + 4;
                  uVar22 = (ulong)(ushort)(puVar21[3] << 8 | puVar21[3] >> 8);
                  if ((ulong)((long)puVar36 - (long)puVar35) < uVar22) {
                    return 0x32;
                  }
                  if ((ushort *)((long)puVar21 + uVar22 + 8) != puVar36) {
                    return 0x32;
                  }
                  if (((tls->field_7).client.key_exchange.algo)->id !=
                      (uint16_t)(puVar21[2] << 8 | puVar21[2] >> 8)) {
                    return 0x2f;
                  }
                }
                else if (uVar18 == 0x29) {
                  if (uVar16 < 2) {
                    return 0x32;
                  }
                  if (puVar21 + 3 != puVar36) {
                    return 0x32;
                  }
                  mess_start = (size_t)(ushort)(puVar21[2] << 8 | puVar21[2] >> 8);
                }
                else if (uVar18 == 0x2b) {
                  return 0x32;
                }
                puVar21 = puVar36;
              } while (puVar36 != puVar39);
              if (puVar39 != (ushort *)(puVar43 + uVar33)) {
                return 0x32;
              }
              if ((short)mess_start != -1) {
                bVar45 = (tls->field_7).client.field_0x20;
                if ((short)mess_start != 0 || (bVar45 & 1) == 0) {
                  return 0x2f;
                }
                (tls->field_7).client.field_0x20 = bVar45 | 4;
              }
              if (puVar35 == (ushort *)0x0) {
LAB_0010f3ee:
                bVar45 = (tls->field_7).client.field_0x20;
                if ((bVar45 & 4) == 0) {
                  return 0x2f;
                }
              }
              else {
                psVar7 = (tls->field_7).client.key_exchange.ctx;
                pVar53.len = uVar22;
                pVar53.base = (uint8_t *)puVar35;
                iVar17 = (*psVar7->on_exchange)(psVar7,(ptls_iovec_t *)&ch,pVar53);
                if (iVar17 != 0) {
                  return iVar17;
                }
                bVar45 = (tls->field_7).client.field_0x20;
              }
              if ((bVar45 & 5) == 1) {
                psVar25 = tls->key_schedule;
                if (psVar25->generation != 1) {
                  __assert_fail("sched->generation == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                                ,0x223,"int key_schedule_reset_psk(struct st_ptls_key_schedule_t *)"
                               );
                }
                psVar25->secret[0x2c] = '\0';
                psVar25->secret[0x2d] = '\0';
                psVar25->secret[0x2e] = '\0';
                psVar25->secret[0x2f] = '\0';
                psVar25->secret[0x30] = '\0';
                psVar25->secret[0x31] = '\0';
                psVar25->secret[0x32] = '\0';
                psVar25->secret[0x33] = '\0';
                psVar25->secret[0x34] = '\0';
                psVar25->secret[0x35] = '\0';
                psVar25->secret[0x36] = '\0';
                psVar25->secret[0x37] = '\0';
                psVar25->secret[0x38] = '\0';
                psVar25->secret[0x39] = '\0';
                psVar25->secret[0x3a] = '\0';
                psVar25->secret[0x3b] = '\0';
                psVar25->secret[0x1c] = '\0';
                psVar25->secret[0x1d] = '\0';
                psVar25->secret[0x1e] = '\0';
                psVar25->secret[0x1f] = '\0';
                psVar25->secret[0x20] = '\0';
                psVar25->secret[0x21] = '\0';
                psVar25->secret[0x22] = '\0';
                psVar25->secret[0x23] = '\0';
                psVar25->secret[0x24] = '\0';
                psVar25->secret[0x25] = '\0';
                psVar25->secret[0x26] = '\0';
                psVar25->secret[0x27] = '\0';
                psVar25->secret[0x28] = '\0';
                psVar25->secret[0x29] = '\0';
                psVar25->secret[0x2a] = '\0';
                psVar25->secret[0x2b] = '\0';
                psVar25->secret[0xc] = '\0';
                psVar25->secret[0xd] = '\0';
                psVar25->secret[0xe] = '\0';
                psVar25->secret[0xf] = '\0';
                psVar25->secret[0x10] = '\0';
                psVar25->secret[0x11] = '\0';
                psVar25->secret[0x12] = '\0';
                psVar25->secret[0x13] = '\0';
                psVar25->secret[0x14] = '\0';
                psVar25->secret[0x15] = '\0';
                psVar25->secret[0x16] = '\0';
                psVar25->secret[0x17] = '\0';
                psVar25->secret[0x18] = '\0';
                psVar25->secret[0x19] = '\0';
                psVar25->secret[0x1a] = '\0';
                psVar25->secret[0x1b] = '\0';
                psVar25->generation = 0;
                psVar25->secret[0] = '\0';
                psVar25->secret[1] = '\0';
                psVar25->secret[2] = '\0';
                psVar25->secret[3] = '\0';
                psVar25->secret[4] = '\0';
                psVar25->secret[5] = '\0';
                psVar25->secret[6] = '\0';
                psVar25->secret[7] = '\0';
                psVar25->secret[8] = '\0';
                psVar25->secret[9] = '\0';
                psVar25->secret[10] = '\0';
                psVar25->secret[0xb] = '\0';
                psVar25->secret[0x3c] = '\0';
                psVar25->secret[0x3d] = '\0';
                psVar25->secret[0x3e] = '\0';
                psVar25->secret[0x3f] = '\0';
                sVar46 = psVar25->algo->digest_size;
                psVar25->generation = 1;
                salt_00.len = sVar46;
                salt_00.base = psVar25->secret;
                ikm_00.len = sVar46;
                ikm_00.base = zeroes_of_max_digest_size;
                ptls_hkdf_extract(psVar25->algo,psVar25->secret,salt_00,ikm_00);
              }
              psVar5 = tls->key_schedule->msghash;
              (*psVar5->update)(psVar5,puVar43,uVar33);
              psVar25 = tls->key_schedule;
              sVar46 = psVar25->algo->digest_size;
              if (ch.compression_methods.ids == (uint8_t *)0x0) {
                puVar43 = zeroes_of_max_digest_size;
                sVar27 = sVar46;
              }
              else {
                puVar43 = ch.compression_methods.ids;
                sVar27 = ch.compression_methods.count;
              }
              psVar25->generation = psVar25->generation + 1;
              salt_01.base = psVar25->secret;
              salt_01.len = sVar46;
              ikm_01.len = sVar27;
              ikm_01.base = puVar43;
              iVar17 = ptls_hkdf_extract(psVar25->algo,salt_01.base,salt_01,ikm_01);
              if (iVar17 != 0) {
                return iVar17;
              }
              iVar17 = setup_traffic_protection
                                 (tls,tls->cipher_suite,1,"client handshake traffic secret");
              if (iVar17 != 0) {
                return iVar17;
              }
              iVar17 = setup_traffic_protection
                                 (tls,tls->cipher_suite,0,"server handshake traffic secret");
              if (iVar17 != 0) {
                return iVar17;
              }
              tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
              goto LAB_0010ed31;
            }
            if (puVar39 != (ushort *)(puVar43 + uVar33)) {
              return 0x32;
            }
            goto LAB_0010f3ee;
          }
          ppVar29 = *pppVar20;
        } while (ppVar29 != (ptls_cipher_suite_t *)0x0);
      }
    }
    return 0x28;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (uVar3 != '\b') {
      return 10;
    }
    if ((uVar33 & 0xfffffffffffffffe) == 4) {
      return 0x32;
    }
    uVar22 = (ulong)(ushort)(*(ushort *)(puVar43 + 4) << 8 | *(ushort *)(puVar43 + 4) >> 8);
    if (uVar33 - 6 < uVar22) {
      return 0x32;
    }
    puVar39 = (ushort *)(puVar43 + 6);
    puVar35 = puVar39;
    if (uVar22 != 0) {
      puVar35 = (ushort *)(uVar22 + (long)puVar39);
      bVar45 = 0;
      do {
        if ((long)puVar35 - (long)puVar39 < 2) {
          return 0x32;
        }
        uVar16 = *puVar39;
        uVar15 = uVar16 << 8 | uVar16 >> 8;
        if (uVar15 < 8) {
          if ((bVar45 >> (uVar15 & 0x1f) & 1) != 0) {
            return 0x2f;
          }
          bVar45 = (byte)(1 << ((byte)(uVar16 >> 8) & 0x1f)) & 7 | bVar45;
        }
        if ((ulong)((long)puVar35 - (long)(puVar39 + 1)) < 2) {
          return 0x32;
        }
        uVar22 = (ulong)(ushort)(puVar39[1] << 8 | puVar39[1] >> 8);
        if (((long)puVar35 - (long)puVar39) - 4U < uVar22) {
          return 0x32;
        }
        if (uVar15 == 0x2a) {
          if (((tls->field_7).client.field_0x20 & 2) == 0) {
            return 0x2f;
          }
          if (properties != (ptls_handshake_properties_t *)0x0) {
            *(byte *)((long)properties + 0x18) = *(byte *)((long)properties + 0x18) | 1;
          }
        }
        else if (uVar15 == 0) {
          if (uVar22 != 0) {
            return 0x32;
          }
          if (tls->server_name == (char *)0x0) {
            return 0x2f;
          }
        }
        puVar39 = (ushort *)((long)puVar39 + uVar22 + 4);
      } while (puVar39 != puVar35);
    }
    if (puVar35 != (ushort *)(puVar43 + uVar33)) {
      return 0x32;
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar43,uVar33);
    tls->state = (uint)(((tls->field_7).client.field_0x20 & 4) >> 2) * 2 +
                 PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (uVar3 != '\v') {
      return 10;
    }
    if (uVar33 == 4) {
      return 0x32;
    }
    if (uVar33 - 5 < (ulong)puVar43[4]) {
      return 0x32;
    }
    if (puVar43[4] != 0) {
      return 0x2f;
    }
    if (uVar33 - 5 < 3) {
      return 0x32;
    }
    lVar42 = 5;
    uVar22 = 0;
    do {
      uVar22 = (ulong)puVar43[lVar42] | uVar22 << 8;
      lVar42 = lVar42 + 1;
    } while (lVar42 != 8);
    if (uVar33 - 8 < uVar22) {
      return 0x32;
    }
    puVar39 = (ushort *)(puVar43 + 8);
    puVar35 = (ushort *)(puVar43 + uVar22 + 8);
    uVar22 = 0;
    do {
      if ((ulong)((long)puVar35 - (long)puVar39) < 3) {
        return 0x32;
      }
      lVar42 = 0;
      uVar23 = 0;
      do {
        uVar23 = (ulong)*(byte *)((long)puVar39 + lVar42) | uVar23 << 8;
        lVar42 = lVar42 + 1;
      } while (lVar42 != 3);
      pcVar30 = (char *)((long)puVar39 + 3);
      if ((ulong)((long)puVar35 - (long)pcVar30) < uVar23) {
        return 0x32;
      }
      sVar46 = uVar22;
      if (uVar22 < 0x10) {
        sVar46 = uVar22 + 1;
        *(char **)(ch.signature_algorithms.list + uVar22 * 8 + -0x10) = pcVar30;
        *(ulong *)(ch.signature_algorithms.list + uVar22 * 8 + -0xc) = uVar23;
      }
      puVar21 = (ushort *)(pcVar30 + uVar23);
      if ((ulong)((long)puVar35 - (long)puVar21) < 2) {
        return 0x32;
      }
      puVar36 = puVar21 + 1;
      uVar22 = (ulong)(ushort)(*puVar21 << 8 | *puVar21 >> 8);
      if ((ulong)((long)puVar35 - (long)puVar36) < uVar22) {
        return 0x32;
      }
      puVar39 = puVar36;
      if (uVar22 != 0) {
        puVar39 = (ushort *)((long)puVar21 + uVar22 + 2);
        bVar45 = 0;
        do {
          if ((long)puVar39 - (long)puVar36 < 2) {
            return 0x32;
          }
          uVar16 = *puVar36;
          uVar15 = uVar16 << 8 | uVar16 >> 8;
          if (uVar15 < 8) {
            if ((bVar45 >> (uVar15 & 0x1f) & 1) != 0) {
              return 0x2f;
            }
            bVar45 = (byte)(1 << ((byte)(uVar16 >> 8) & 0x1f)) & 7 | bVar45;
          }
          if ((ulong)((long)puVar39 - (long)(puVar36 + 1)) < 2) {
            return 0x32;
          }
          uVar22 = (ulong)(ushort)(puVar36[1] << 8 | puVar36[1] >> 8);
          if ((ulong)((long)puVar39 - (long)(puVar36 + 2)) < uVar22) {
            return 0x32;
          }
          puVar36 = (ushort *)((long)(puVar36 + 2) + uVar22);
        } while (puVar36 != puVar39);
      }
      uVar22 = sVar46;
    } while (puVar39 != puVar35);
    if (puVar35 != (ushort *)(puVar43 + uVar33)) {
      return 0x32;
    }
    psVar6 = tls->ctx->verify_certificate;
    if ((psVar6 != (st_ptls_verify_certificate_t *)0x0) &&
       (iVar17 = (*psVar6->cb)(psVar6,tls,&(tls->field_7).client.certificate_verify.cb,
                               &(tls->field_7).client.certificate_verify.verify_ctx,
                               (ptls_iovec_t *)&ch,sVar46), iVar17 != 0)) {
      return iVar17;
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar43,uVar33);
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (uVar3 != '\x0f') {
      return 10;
    }
    if ((long)uVar33 < 6) {
      return 0x32;
    }
    if ((uVar33 & 0x7ffffffffffffffe) == 6) {
      return 0x32;
    }
    uVar16 = *(ushort *)(puVar43 + 6) << 8 | *(ushort *)(puVar43 + 6) >> 8;
    if (puVar43 + (ulong)uVar16 + 8 != puVar43 + uVar33 || uVar33 - 8 < (ulong)uVar16) {
      return 0x32;
    }
    uVar15 = *(ushort *)(puVar43 + 4) << 8 | *(ushort *)(puVar43 + 4) >> 8;
    if ((uVar15 != 0x804) && (uVar15 != 0x403)) {
      return 0x2f;
    }
    sVar46 = build_certificate_verify_signdata
                       ((uint8_t *)&ch,tls->key_schedule,(char *)(puVar43 + (ulong)uVar16 + 8));
    p_Var4 = (tls->field_7).client.certificate_verify.cb;
    if (p_Var4 == (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
      iVar17 = 0;
    }
    else {
      pVar56.len = sVar46;
      pVar56.base = (uint8_t *)&ch;
      pVar57.len._0_2_ = uVar16;
      pVar57.base = puVar43 + 8;
      pVar57.len._2_6_ = 0;
      iVar17 = (*p_Var4)((tls->field_7).client.certificate_verify.verify_ctx,pVar56,pVar57);
    }
    (*ptls_clear_memory)(&ch,sVar46);
    (tls->field_7).client.certificate_verify.cb =
         (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0;
    if (iVar17 != 0) {
      return iVar17;
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar43,uVar33);
    tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
    break;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (uVar3 != '\x14') {
      return 10;
    }
    iVar17 = verify_finished(tls,message);
    if (iVar17 == 0) {
      psVar5 = tls->key_schedule->msghash;
      (*psVar5->update)(psVar5,puVar43,uVar33);
      psVar25 = tls->key_schedule;
      sVar46 = psVar25->algo->digest_size;
      psVar25->generation = psVar25->generation + 1;
      salt.base = psVar25->secret;
      salt.len = sVar46;
      ikm.len = sVar46;
      ikm.base = zeroes_of_max_digest_size;
      iVar17 = ptls_hkdf_extract(psVar25->algo,salt.base,salt,ikm);
      if (((iVar17 == 0) &&
          (iVar17 = setup_traffic_protection
                              (tls,tls->cipher_suite,0,"server application traffic secret"),
          iVar17 == 0)) &&
         (iVar17 = derive_secret(tls->key_schedule,&ch,"client application traffic secret"),
         iVar17 == 0)) {
        send_finished(tls,sendbuf);
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x30) =
             ch.signature_algorithms.list._16_8_;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x38) =
             ch.signature_algorithms.list._24_8_;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x20) =
             ch.signature_algorithms.list._0_8_;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x28) =
             ch.signature_algorithms.list._8_8_;
        *(ulong *)((tls->traffic_protection).enc.secret + 0x10) =
             CONCAT62(ch._18_6_,ch.selected_version);
        *(ptls_key_exchange_algorithm_t **)((tls->traffic_protection).enc.secret + 0x18) =
             ch.negotiated_group;
        *(uint8_t **)(tls->traffic_protection).enc.secret = ch.compression_methods.ids;
        *(size_t *)((tls->traffic_protection).enc.secret + 8) = ch.compression_methods.count;
        iVar17 = setup_traffic_protection(tls,tls->cipher_suite,1,(char *)0x0);
        if (iVar17 == 0) {
          tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
          iVar17 = 0;
        }
      }
    }
    psVar40 = &ch;
    goto LAB_0010ed70;
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    if (uVar3 != '\x01') {
      return 0x28;
    }
    certs = (ptls_iovec_t *)0x0;
    num_certs = 0;
    sign_algorithm = 0;
    signer = (_func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t *)0x0;
    signer_data = (void *)0x0;
    pubkey.base = (uint8_t *)0x0;
    pubkey.len = 0;
    ecdh_secret.base = (uint8_t *)0x0;
    ecdh_secret.len = 0;
    if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
      __assert_fail("tls->key_schedule == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                    ,0x69c,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
    }
    memset(&ch,0,0x128);
    iVar19 = 0x32;
    iVar17 = iVar19;
    if (5 < (long)uVar33) {
      if ((ushort)(*(ushort *)(puVar43 + 4) << 8 | *(ushort *)(puVar43 + 4) >> 8) == 0x303) {
        if (0x26 < uVar33) {
          puVar39 = (ushort *)(puVar43 + uVar33);
          uVar22 = (ulong)puVar43[0x26];
          if ((puVar43[0x26] < 0x21 && uVar22 <= uVar33 - 0x27) &&
              1 < (ulong)((long)puVar39 - (long)(puVar43 + uVar22 + 0x27))) {
            uVar16 = *(ushort *)(puVar43 + uVar22 + 0x27);
            uVar23 = (ulong)(ushort)(uVar16 << 8 | uVar16 >> 8);
            puVar35 = (ushort *)(puVar43 + uVar22 + 0x29);
            if (uVar23 <= (ulong)((long)puVar39 - (long)puVar35)) {
              puVar21 = (ushort *)(uVar23 + (long)puVar35);
              do {
                puVar36 = puVar35;
                if ((long)puVar21 - (long)puVar36 < 2) goto LAB_0010ed47;
                if (tls->cipher_suite == (ptls_cipher_suite_t *)0x0) {
                  pppVar20 = tls->ctx->cipher_suites;
                  ppVar29 = *pppVar20;
                  bVar51 = true;
                  if (ppVar29 != (ptls_cipher_suite_t *)0x0) {
                    do {
                      pppVar20 = pppVar20 + 1;
                      if (ppVar29->id == (uint16_t)(*puVar36 << 8 | *puVar36 >> 8)) {
                        tls->cipher_suite = ppVar29;
                        goto LAB_0010e74b;
                      }
                      ppVar29 = *pppVar20;
                      bVar51 = true;
                    } while (ppVar29 != (ptls_cipher_suite_t *)0x0);
                  }
                }
                else {
LAB_0010e74b:
                  bVar51 = false;
                }
                puVar35 = puVar36 + 1;
              } while (puVar36 + 1 != puVar21);
              if (bVar51) goto LAB_0010ed41;
              if ((((puVar21 != puVar39) && (uVar22 = (ulong)(byte)*puVar21, uVar22 != 0)) &&
                  (pbVar31 = (byte *)((long)puVar36 + 3),
                  uVar22 <= (ulong)((long)puVar39 - (long)pbVar31))) &&
                 (pbVar37 = (byte *)((long)puVar21 + uVar22 + 1),
                 ch.compression_methods.count = (long)pbVar37 - (long)pbVar31,
                 ch.compression_methods.ids = pbVar31, 1 < (ulong)((long)puVar39 - (long)pbVar37)))
              {
                mess_start = (long)puVar21 + uVar22 + 3;
                uVar16 = *(ushort *)((long)puVar21 + uVar22 + 1);
                uVar23 = (ulong)(ushort)(uVar16 << 8 | uVar16 >> 8);
                if (uVar23 <= (long)puVar39 - mess_start) {
                  if (uVar23 == 0) {
                    bVar51 = false;
                  }
                  else {
                    local_470 = (byte *)((long)puVar21 + uVar23 + uVar22 + 2);
                    pbVar31 = (byte *)((long)puVar21 + uVar23 + uVar22 + 2 + 1);
                    local_468 = &tls->server_name;
                    local_490 = 0;
                    do {
                      iVar17 = iVar19;
                      if ((long)((long)pbVar31 - mess_start) < 2) goto LAB_0010ed47;
                      uVar16 = *(ushort *)mess_start;
                      uVar15 = uVar16 << 8 | uVar16 >> 8;
                      local_478 = CONCAT62(local_478._2_6_,uVar15);
                      uVar18 = (uint)uVar15;
                      if (uVar15 < 8) {
                        if (((byte)local_490 >> (uVar18 & 0x1f) & 1) == 0) {
                          uVar22 = (ulong)(uint)(1 << ((byte)(uVar16 >> 8) & 0x1f)) &
                                   0xffffffffffffff07;
                          local_490 = CONCAT71((int7)(uVar22 >> 8),(byte)uVar22 | (byte)local_490);
                          goto LAB_0010eedb;
                        }
                        goto LAB_0010f5f8;
                      }
LAB_0010eedb:
                      if ((long)pbVar31 - (mess_start + 2) < 2) goto LAB_0010ed47;
                      uVar22 = (ulong)(ushort)(*(ushort *)(mess_start + 2) << 8 |
                                              *(ushort *)(mess_start + 2) >> 8);
                      puVar1 = (uint8_t *)(mess_start + 4);
                      if ((ulong)((long)pbVar31 - (long)puVar1) < uVar22) goto LAB_0010ed47;
                      local_488 = mess_start + 3;
                      puVar35 = (ushort *)(uVar22 + local_488 + 1);
                      if (uVar15 < 0x28) {
                        if (uVar18 == 0) {
                          iVar17 = client_hello_decode_server_name
                                             (local_468,puVar1,(uint8_t *)puVar35);
                        }
                        else {
                          if (uVar18 != 10) {
                            if (uVar18 != 0xd) goto switchD_0010ef54_default;
                            if (1 < (ulong)((long)puVar35 - (long)puVar1)) {
                              uVar23 = (ulong)(ushort)(*(ushort *)(mess_start + 4) << 8 |
                                                      *(ushort *)(mess_start + 4) >> 8);
                              if (uVar23 <= (long)puVar35 - (mess_start + 6)) {
                                puVar21 = (ushort *)(mess_start + 6 + uVar23);
                                lVar42 = mess_start + 7;
                                sVar46 = ch.signature_algorithms.count;
                                do {
                                  if ((long)uVar23 < 2) goto LAB_0010ed47;
                                  uVar38 = sVar46;
                                  if (sVar46 < 0x10) {
                                    uVar38 = sVar46 + 1;
                                    ch.signature_algorithms.list[sVar46] =
                                         *(ushort *)(lVar42 + -1) << 8 |
                                         *(ushort *)(lVar42 + -1) >> 8;
                                    ch.signature_algorithms.count = uVar38;
                                  }
                                  lVar42 = lVar42 + 2;
                                  uVar23 = uVar23 - 2;
                                  sVar46 = uVar38;
                                } while (uVar23 != 0);
                                goto LAB_0010f0f6;
                              }
                            }
                            goto LAB_0010ed47;
                          }
                          iVar17 = client_hello_select_negotiated_group
                                             (&ch.negotiated_group,tls->ctx->key_exchanges,puVar1,
                                              (uint8_t *)puVar35);
                        }
LAB_0010f05d:
                        if (iVar17 == 0) goto switchD_0010ef54_default;
                        goto LAB_0010ed47;
                      }
                      switch(uVar18) {
                      case 0x28:
                        iVar17 = client_hello_decode_key_share
                                           (&ch.key_share.algorithm,&ch.key_share.peer,
                                            tls->ctx->key_exchanges,puVar1,(uint8_t *)puVar35);
                        goto LAB_0010f05d;
                      case 0x29:
                        if (1 < (ulong)((long)puVar35 - (long)puVar1)) {
                          uVar23 = (ulong)(ushort)(*(ushort *)(mess_start + 4) << 8 |
                                                  *(ushort *)(mess_start + 4) >> 8);
                          puVar21 = (ushort *)(mess_start + 6);
                          if (uVar23 <= (ulong)((long)puVar35 - (long)puVar21)) {
                            puVar36 = (ushort *)(uVar23 + (long)puVar21);
                            sVar46 = ch.psk.identities.count;
                            lVar42 = 1;
                            do {
                              lVar32 = lVar42;
                              if ((ulong)((long)puVar36 - (long)puVar21) < 2) goto LAB_0010ed47;
                              uVar23 = (ulong)(ushort)(*puVar21 << 8 | *puVar21 >> 8);
                              puVar21 = puVar21 + 1;
                              if (((ulong)((long)puVar36 - (long)puVar21) < uVar23) ||
                                 ((long)((long)puVar36 - ((long)puVar21 + uVar23)) < 4))
                              goto LAB_0010ed47;
                              uVar38 = sVar46;
                              if (sVar46 < 4) {
                                uVar18 = *(uint *)((long)puVar21 + uVar23);
                                uVar38 = sVar46 + 1;
                                ch.psk.identities.list[sVar46].identity.base = (uint8_t *)puVar21;
                                ch.psk.identities.list[sVar46].identity.len = uVar23;
                                ch.psk.identities.list[sVar46].obfuscated_ticket_age =
                                     uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 |
                                     (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
                                *(undefined1 (*) [16])&ch.psk.identities.list[sVar46].field_0x14 =
                                     (undefined1  [16])0x0;
                                ch.psk.identities.count = uVar38;
                                *(undefined4 *)
                                 ((long)&ch.psk.identities.list[sVar46].binder.len + 4) = 0;
                              }
                              puVar21 = (ushort *)((long)puVar21 + uVar23 + 4);
                              sVar46 = uVar38;
                              lVar42 = lVar32 + 1;
                            } while (puVar21 != puVar36);
                            ch.psk.hash_end = (uint8_t *)puVar36;
                            if (1 < (ulong)((long)puVar35 - (long)puVar36)) {
                              puVar24 = puVar36 + 1;
                              uVar23 = (ulong)(ushort)(*puVar36 << 8 | *puVar36 >> 8);
                              if (uVar23 <= (ulong)((long)puVar35 - (long)puVar24)) {
                                puVar21 = (ushort *)(uVar23 + (long)puVar24);
                                psVar41 = &ch.psk.identities.list[0].binder.len;
                                uVar23 = 0;
                                do {
                                  if (puVar21 == puVar24) goto LAB_0010ed47;
                                  uVar44 = (ulong)(byte)*puVar24;
                                  pbVar37 = (byte *)((long)puVar24 + 1);
                                  if ((ulong)((long)puVar21 - (long)pbVar37) < uVar44)
                                  goto LAB_0010ed47;
                                  if (uVar23 < uVar38) {
                                    ((ptls_iovec_t *)(psVar41 + -1))->base = pbVar37;
                                    *psVar41 = uVar44;
                                  }
                                  puVar24 = (ushort *)(pbVar37 + uVar44);
                                  uVar23 = uVar23 + 1;
                                  lVar32 = lVar32 + -1;
                                  psVar41 = psVar41 + 5;
                                } while (puVar24 != puVar21);
                                if (lVar32 == 0) goto LAB_0010f0f6;
LAB_0010f5f8:
                                iVar17 = 0x2f;
                              }
                            }
                          }
                        }
                        goto LAB_0010ed47;
                      case 0x2a:
                        ch.psk.early_data_indication = 1;
                        break;
                      case 0x2b:
                        if (uVar22 == 0) goto LAB_0010ed47;
                        uVar23 = (ulong)*(byte *)(mess_start + 4);
                        puVar36 = (ushort *)(mess_start + 5);
                        if ((ulong)((long)puVar35 - (long)puVar36) < uVar23) goto LAB_0010ed47;
                        puVar21 = (ushort *)((long)puVar36 + uVar23);
                        uVar34 = ch.selected_version;
                        do {
                          if ((long)uVar23 < 2) goto LAB_0010ed47;
                          if ((uVar34 == 0) && ((ushort)(*puVar36 << 8 | *puVar36 >> 8) == 0x7f12))
                          {
                            ch.selected_version = 0x7f12;
                            uVar34 = 0x7f12;
                          }
                          uVar23 = uVar23 - 2;
                          puVar36 = puVar36 + 1;
                        } while (puVar36 != puVar21);
LAB_0010f0f6:
                        if (puVar21 != puVar35) goto LAB_0010ed47;
                        break;
                      case 0x2c:
                        if (uVar22 != 0) goto LAB_0010f5f8;
                        break;
                      case 0x2d:
                        if (uVar22 == 0) goto LAB_0010ed47;
                        uVar23 = 0;
                        uVar18 = ch.psk.ke_modes;
                        do {
                          if (puVar1[uVar23] < 0x20) {
                            uVar18 = uVar18 | 1 << (puVar1[uVar23] & 0x1f);
                            ch.psk.ke_modes = uVar18;
                          }
                          uVar23 = uVar23 + 1;
                        } while (uVar22 != uVar23);
                      }
switchD_0010ef54_default:
                      mess_start = (size_t)puVar35;
                    } while ((byte *)(local_488 + uVar22) != local_470);
                    bVar51 = (short)local_478 == 0x29;
                    mess_start = (size_t)pbVar31;
                  }
                  puVar1 = ch.psk.hash_end;
                  iVar17 = iVar19;
                  if (((ushort *)mess_start == puVar39) &&
                     (iVar17 = 0x46, ch.selected_version == 0x7f12)) {
                    iVar17 = 0x2f;
                    if (((ch.compression_methods.count == 1) &&
                        (((*ch.compression_methods.ids == '\0' &&
                          (iVar17 = 0x6d,
                          ch.negotiated_group != (ptls_key_exchange_algorithm_t *)0x0)) &&
                         (ch.signature_algorithms.count != 0)))) &&
                       (ch.key_share.algorithm != (ptls_key_exchange_algorithm_t *)0x0)) {
                      if (ch.psk.hash_end == (uint8_t *)0x0) {
                        iVar17 = 0x2f;
                        if (ch.psk.early_data_indication == 0 && ch.psk.ke_modes == 0)
                        goto LAB_0010f63c;
                      }
                      else {
                        iVar17 = 0x2f;
                        if (bVar51) {
LAB_0010f63c:
                          psVar25 = key_schedule_new(tls->cipher_suite->hash);
                          tls->key_schedule = psVar25;
                          if (tls->ctx->require_dhe_on_psk != 0) {
                            ch.psk.ke_modes = ch.psk.ke_modes & 0xfffffffe;
                          }
                          if (((puVar1 == (uint8_t *)0x0) || ((ch.psk.ke_modes & 3) == 0)) ||
                             (tls->ctx->decrypt_ticket == (ptls_encrypt_ticket_t *)0x0)) {
                            (*psVar25->msghash->update)(psVar25->msghash,puVar43,uVar33);
LAB_0010f863:
                            psVar25 = tls->key_schedule;
                            sVar46 = psVar25->algo->digest_size;
                            psVar25->generation = psVar25->generation + 1;
                            salt_03.base = psVar25->secret;
                            salt_03.len = sVar46;
                            ikm_03.len = sVar46;
                            ikm_03.base = zeroes_of_max_digest_size;
                            ptls_hkdf_extract(psVar25->algo,salt_03.base,salt_03,ikm_03);
                            mess_start = 0xffffffffffffffff;
                            bVar12 = true;
                            bVar51 = true;
                          }
                          else {
                            (*psVar25->msghash->update)
                                      (psVar25->msghash,puVar43,(long)puVar1 - (long)puVar43);
                            decbuf.capacity = 0x100;
                            decbuf.base = finished_key;
                            decbuf._16_12_ = ZEXT812(0);
                            mess_start = 0xffffffffffffffff;
                            if (ch.psk.identities.count != 0) {
                              psVar41 = &ch.psk.identities.list[0].binder.len;
                              uVar33 = 0;
                              do {
                                auVar11._8_8_ = 0;
                                auVar11._0_8_ = decbuf._24_8_;
                                decbuf._16_16_ = auVar11 << 0x40;
                                psVar9 = tls->ctx->decrypt_ticket;
                                iVar17 = (*psVar9->cb)(psVar9,tls,&decbuf,
                                                       *(ptls_iovec_t *)(psVar41 + -4));
                                if (iVar17 == 0) {
                                  iVar17 = decode_session_identifier
                                                     (&issue_at,&ticket_psk,&age_add,
                                                      &ticket_server_name,&ticket_csid,decbuf.base,
                                                      decbuf.base + decbuf.off);
                                  sVar46 = ticket_server_name.len;
                                  if (iVar17 == 0) {
                                    pcVar30 = tls->server_name;
                                    if (ticket_server_name.len == 0) {
                                      if (pcVar30 == (char *)0x0) goto LAB_0010f7ad;
                                    }
                                    else if (((pcVar30 != (char *)0x0) &&
                                             (iVar17 = strncmp(pcVar30,(char *)ticket_server_name.
                                                                               base,
                                                               ticket_server_name.len), iVar17 == 0)
                                             ) && (pcVar30[sVar46] == '\0')) {
LAB_0010f7ad:
                                      if (ticket_csid == tls->cipher_suite->id) {
                                        psVar25 = tls->key_schedule;
                                        if ((ticket_psk.len == psVar25->algo->digest_size) &&
                                           (*psVar41 == ticket_psk.len)) {
                                          puVar43 = zeroes_of_max_digest_size;
                                          if (ticket_psk.base != (uint8_t *)0x0) {
                                            puVar43 = ticket_psk.base;
                                          }
                                          psVar25->generation = psVar25->generation + 1;
                                          salt_02.base = psVar25->secret;
                                          salt_02.len = ticket_psk.len;
                                          ikm_02.len = ticket_psk.len;
                                          ikm_02.base = puVar43;
                                          iVar17 = ptls_hkdf_extract(psVar25->algo,salt_02.base,
                                                                     salt_02,ikm_02);
                                          mess_start = uVar33;
                                          if (((iVar17 == 0) &&
                                              (iVar17 = derive_secret(tls->key_schedule,binder_key,
                                                                      "resumption psk binder key"),
                                              iVar17 == 0)) &&
                                             (iVar17 = calc_verify_data(&max_early_data_size,
                                                                        tls->key_schedule,binder_key
                                                                       ), iVar17 == 0)) {
                                            iVar19 = bcmp(((ptls_iovec_t *)(psVar41 + -1))->base,
                                                          &max_early_data_size,
                                                          tls->key_schedule->algo->digest_size);
                                            iVar17 = 0x33;
                                            if (iVar19 == 0) {
                                              iVar17 = 0;
                                            }
                                          }
                                          goto LAB_0010fdc2;
                                        }
                                      }
                                    }
                                  }
                                }
                                uVar33 = uVar33 + 1;
                                psVar41 = psVar41 + 5;
                              } while (uVar33 < ch.psk.identities.count);
                            }
                            iVar17 = 0;
LAB_0010fdc2:
                            (*ptls_clear_memory)(decbuf.base,decbuf.off);
                            if (decbuf.is_allocated != 0) {
                              free(decbuf.base);
                            }
                            decbuf.off = 0;
                            decbuf.is_allocated = 0;
                            decbuf._28_4_ = 0;
                            decbuf.base = (uint8_t *)0x0;
                            decbuf.capacity = 0;
                            (*ptls_clear_memory)(binder_key,0x40);
                            (*ptls_clear_memory)(&max_early_data_size,0x40);
                            if (iVar17 != 0) goto LAB_0010ed47;
                            psVar5 = tls->key_schedule->msghash;
                            (*psVar5->update)(psVar5,ch.psk.hash_end,
                                              (long)puVar39 - (long)ch.psk.hash_end);
                            if (mess_start == 0xffffffffffffffff) goto LAB_0010f863;
                            if ((ch.psk.ke_modes & 1) == 0) {
                              if ((ch.psk.ke_modes & 2) == 0) {
                                __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                                              ,0x6b9,
                                              "int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)"
                                             );
                              }
                              bVar51 = true;
                              bVar12 = false;
                            }
                            else {
                              bVar12 = false;
                              bVar51 = false;
                            }
                          }
                          if (((ch.psk.early_data_indication == 0) || (mess_start != 0)) ||
                             (tls->ctx->max_early_data_size == 0)) {
LAB_0010f8eb:
                            if ((bool)(ch.key_share.algorithm == &key_exchange_no_match & bVar51)) {
                              iVar17 = 0x28;
                              if ((ch.negotiated_group != (ptls_key_exchange_algorithm_t *)0x0) &&
                                 (iVar17 = ptls_buffer_reserve(sendbuf,3), iVar17 == 0)) {
                                puVar1 = sendbuf->base;
                                sVar46 = sendbuf->off;
                                puVar43 = puVar1 + sVar46;
                                puVar43[0] = '\x16';
                                puVar43[1] = '\x03';
                                puVar1[sVar46 + 2] = '\x01';
                                sendbuf->off = sendbuf->off + 3;
                                iVar17 = ptls_buffer_reserve(sendbuf,2);
                                if (iVar17 == 0) {
                                  puVar43 = sendbuf->base;
                                  sVar46 = sendbuf->off;
                                  (puVar43 + sVar46)[0] = '\0';
                                  (puVar43 + sVar46)[1] = '\0';
                                  sVar46 = sendbuf->off;
                                  sendbuf->off = sVar46 + 2;
                                  iVar17 = ptls_buffer_reserve(sendbuf,1);
                                  if (iVar17 == 0) {
                                    sendbuf->base[sendbuf->off] = '\x06';
                                    sendbuf->off = sendbuf->off + 1;
                                    iVar17 = ptls_buffer_reserve(sendbuf,3);
                                    if (iVar17 == 0) {
                                      puVar43 = sendbuf->base;
                                      sVar27 = sendbuf->off;
                                      puVar43[sVar27 + 2] = '\0';
                                      puVar43 = puVar43 + sVar27;
                                      puVar43[0] = '\0';
                                      puVar43[1] = '\0';
                                      sVar48 = sendbuf->off;
                                      sVar27 = sVar48 + 3;
                                      sendbuf->off = sVar27;
                                      iVar17 = ptls_buffer_reserve(sendbuf,2);
                                      if (iVar17 == 0) {
                                        puVar43 = sendbuf->base;
                                        sVar47 = sendbuf->off;
                                        (puVar43 + sVar47)[0] = '\x7f';
                                        (puVar43 + sVar47)[1] = '\x12';
                                        sendbuf->off = sendbuf->off + 2;
                                        iVar17 = ptls_buffer_reserve(sendbuf,2);
                                        if (iVar17 == 0) {
                                          puVar43 = sendbuf->base;
                                          sVar47 = sendbuf->off;
                                          (puVar43 + sVar47)[0] = '\0';
                                          (puVar43 + sVar47)[1] = '\0';
                                          sVar47 = sendbuf->off;
                                          sendbuf->off = sVar47 + 2;
                                          iVar17 = ptls_buffer_reserve(sendbuf,2);
                                          if (iVar17 == 0) {
                                            puVar43 = sendbuf->base;
                                            sVar49 = sendbuf->off;
                                            (puVar43 + sVar49)[0] = '\0';
                                            (puVar43 + sVar49)[1] = '(';
                                            sendbuf->off = sendbuf->off + 2;
                                            iVar17 = ptls_buffer_reserve(sendbuf,2);
                                            if (iVar17 == 0) {
                                              puVar43 = sendbuf->base;
                                              sVar49 = sendbuf->off;
                                              (puVar43 + sVar49)[0] = '\0';
                                              (puVar43 + sVar49)[1] = '\0';
                                              sVar49 = sendbuf->off;
                                              sendbuf->off = sVar49 + 2;
                                              local_490 = CONCAT62(local_490._2_6_,
                                                                   (ch.negotiated_group)->id);
                                              iVar17 = ptls_buffer_reserve(sendbuf,2);
                                              if (iVar17 == 0) {
                                                *(ushort *)(sendbuf->base + sendbuf->off) =
                                                     (ushort)local_490 << 8 | (ushort)local_490 >> 8
                                                ;
                                                sVar28 = sendbuf->off;
                                                sendbuf->off = sVar28 + 2;
                                                lVar42 = sVar28 - sVar49;
                                                sendbuf->base[sVar49] =
                                                     (uint8_t)((ulong)lVar42 >> 8);
                                                sendbuf->base[sVar49 + 1] = (uint8_t)lVar42;
                                                iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                if (iVar17 == 0) {
                                                  puVar43 = sendbuf->base;
                                                  sVar49 = sendbuf->off;
                                                  (puVar43 + sVar49)[0] = '\0';
                                                  (puVar43 + sVar49)[1] = '\r';
                                                  sendbuf->off = sendbuf->off + 2;
                                                  iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar17 == 0) {
                                                    puVar43 = sendbuf->base;
                                                    sVar49 = sendbuf->off;
                                                    (puVar43 + sVar49)[0] = '\0';
                                                    (puVar43 + sVar49)[1] = '\0';
                                                    sVar49 = sendbuf->off;
                                                    sendbuf->off = sVar49 + 2;
                                                    sendbuf->base[sVar49] = '\0';
                                                    sendbuf->base[sVar49 + 1] = '\0';
                                                    lVar42 = sendbuf->off - (sVar47 + 2);
                                                    sendbuf->base[sVar47] =
                                                         (uint8_t)((ulong)lVar42 >> 8);
                                                    sendbuf->base[sVar47 + 1] = (uint8_t)lVar42;
                                                    sVar47 = sendbuf->off;
                                                    lVar42 = 0x10;
                                                    do {
                                                      sendbuf->base[sVar48] =
                                                           (uint8_t)(sVar47 - sVar27 >>
                                                                    ((byte)lVar42 & 0x3f));
                                                      lVar42 = lVar42 + -8;
                                                      sVar48 = sVar48 + 1;
                                                    } while (lVar42 != -8);
                                                    lVar42 = sendbuf->off - (sVar46 + 2);
                                                    sendbuf->base[sVar46] =
                                                         (uint8_t)((ulong)lVar42 >> 8);
                                                    sendbuf->base[sVar46 + 1] = (uint8_t)lVar42;
                                                    iVar17 = 0x202;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              if (bVar12) {
                                psVar10 = tls->ctx->lookup_certificate;
                                iVar17 = (*psVar10->cb)(psVar10,tls,&sign_algorithm,&signer,
                                                        &signer_data,&certs,&num_certs,
                                                        tls->server_name,
                                                        ch.signature_algorithms.list,
                                                        ch.signature_algorithms.count);
                                if (iVar17 != 0) goto LAB_0010ed47;
                                if (sign_algorithm == 0) {
                                  __assert_fail("sign_algorithm != 0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                                                ,0x6e4,
                                                "int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)"
                                               );
                                }
                              }
                              if (((!bVar51) ||
                                  (iVar17 = (*(ch.key_share.algorithm)->exchange)
                                                      (&pubkey,&ecdh_secret,ch.key_share.peer),
                                  iVar17 == 0)) &&
                                 (iVar17 = ptls_buffer_reserve(sendbuf,3), iVar17 == 0)) {
                                puVar1 = sendbuf->base;
                                sVar46 = sendbuf->off;
                                puVar43 = puVar1 + sVar46;
                                puVar43[0] = '\x16';
                                puVar43[1] = '\x03';
                                puVar1[sVar46 + 2] = '\x01';
                                sendbuf->off = sendbuf->off + 3;
                                iVar17 = ptls_buffer_reserve(sendbuf,2);
                                if (iVar17 == 0) {
                                  puVar43 = sendbuf->base;
                                  sVar46 = sendbuf->off;
                                  (puVar43 + sVar46)[0] = '\0';
                                  (puVar43 + sVar46)[1] = '\0';
                                  sVar27 = sendbuf->off;
                                  sVar46 = sVar27 + 2;
                                  sendbuf->off = sVar46;
                                  iVar17 = ptls_buffer_reserve(sendbuf,1);
                                  if (iVar17 == 0) {
                                    sendbuf->base[sendbuf->off] = '\x02';
                                    sendbuf->off = sendbuf->off + 1;
                                    iVar17 = ptls_buffer_reserve(sendbuf,3);
                                    if (iVar17 == 0) {
                                      puVar43 = sendbuf->base;
                                      sVar48 = sendbuf->off;
                                      puVar43[sVar48 + 2] = '\0';
                                      puVar43 = puVar43 + sVar48;
                                      puVar43[0] = '\0';
                                      puVar43[1] = '\0';
                                      local_4a0 = sendbuf->off;
                                      local_490 = local_4a0 + 3;
                                      sendbuf->off = local_490;
                                      iVar17 = ptls_buffer_reserve(sendbuf,2);
                                      if (iVar17 == 0) {
                                        puVar43 = sendbuf->base;
                                        sVar48 = sendbuf->off;
                                        (puVar43 + sVar48)[0] = '\x7f';
                                        (puVar43 + sVar48)[1] = '\x12';
                                        sendbuf->off = sendbuf->off + 2;
                                        iVar17 = ptls_buffer_reserve(sendbuf,0x20);
                                        if (iVar17 == 0) {
                                          (*tls->ctx->random_bytes)
                                                    (sendbuf->base + sendbuf->off,0x20);
                                          sendbuf->off = sendbuf->off + 0x20;
                                          local_488 = CONCAT62(local_488._2_6_,tls->cipher_suite->id
                                                              );
                                          iVar17 = ptls_buffer_reserve(sendbuf,2);
                                          if (iVar17 == 0) {
                                            *(ushort *)(sendbuf->base + sendbuf->off) =
                                                 (ushort)local_488 << 8 | (ushort)local_488 >> 8;
                                            sendbuf->off = sendbuf->off + 2;
                                            iVar17 = ptls_buffer_reserve(sendbuf,2);
                                            if (iVar17 == 0) {
                                              puVar43 = sendbuf->base;
                                              sVar48 = sendbuf->off;
                                              (puVar43 + sVar48)[0] = '\0';
                                              (puVar43 + sVar48)[1] = '\0';
                                              local_488 = sendbuf->off;
                                              local_470 = (byte *)(local_488 + 2);
                                              sendbuf->off = (size_t)local_470;
                                              if (bVar51) {
                                                iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                if (iVar17 == 0) {
                                                  puVar43 = sendbuf->base;
                                                  sVar48 = sendbuf->off;
                                                  (puVar43 + sVar48)[0] = '\0';
                                                  (puVar43 + sVar48)[1] = '(';
                                                  sendbuf->off = sendbuf->off + 2;
                                                  iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar17 == 0) {
                                                    puVar43 = sendbuf->base;
                                                    sVar48 = sendbuf->off;
                                                    (puVar43 + sVar48)[0] = '\0';
                                                    (puVar43 + sVar48)[1] = '\0';
                                                    local_478 = sendbuf->off;
                                                    local_468 = (char **)(local_478 + 2);
                                                    sendbuf->off = (size_t)local_468;
                                                    uVar16 = (ch.key_share.algorithm)->id;
                                                    iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                    if (iVar17 == 0) {
                                                      *(ushort *)(sendbuf->base + sendbuf->off) =
                                                           uVar16 << 8 | uVar16 >> 8;
                                                      sendbuf->off = sendbuf->off + 2;
                                                      iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                      if (iVar17 == 0) {
                                                        puVar43 = sendbuf->base;
                                                        sVar48 = sendbuf->off;
                                                        (puVar43 + sVar48)[0] = '\0';
                                                        (puVar43 + sVar48)[1] = '\0';
                                                        sVar48 = sendbuf->off;
                                                        sendbuf->off = sVar48 + 2;
                                                        iVar17 = ptls_buffer__do_pushv
                                                                           (sendbuf,pubkey.base,
                                                                            pubkey.len);
                                                        if (iVar17 == 0) {
                                                          lVar42 = sendbuf->off - (sVar48 + 2);
                                                          sendbuf->base[sVar48] =
                                                               (uint8_t)((ulong)lVar42 >> 8);
                                                          sendbuf->base[sVar48 + 1] =
                                                               (uint8_t)lVar42;
                                                          lVar42 = sendbuf->off - (long)local_468;
                                                          sendbuf->base[local_478] =
                                                               (uint8_t)((ulong)lVar42 >> 8);
                                                          sendbuf->base[local_478 + 1] =
                                                               (uint8_t)lVar42;
                                                          goto LAB_0010fff2;
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                              else {
LAB_0010fff2:
                                                if (bVar12) {
LAB_0010fffb:
                                                  lVar42 = sendbuf->off - (long)local_470;
                                                  sendbuf->base[local_488] =
                                                       (uint8_t)((ulong)lVar42 >> 8);
                                                  sendbuf->base[local_488 + 1] = (uint8_t)lVar42;
                                                  sVar48 = sendbuf->off;
                                                  lVar42 = 0x10;
                                                  do {
                                                    sendbuf->base[local_4a0] =
                                                         (uint8_t)(sVar48 - local_490 >>
                                                                  ((byte)lVar42 & 0x3f));
                                                    lVar42 = lVar42 + -8;
                                                    local_4a0 = local_4a0 + 1;
                                                  } while (lVar42 != -8);
                                                  if (tls->key_schedule !=
                                                      (st_ptls_key_schedule_t *)0x0) {
                                                    psVar5 = tls->key_schedule->msghash;
                                                    (*psVar5->update)(psVar5,sendbuf->base + sVar46,
                                                                      sendbuf->off - sVar46);
                                                  }
                                                  lVar42 = sendbuf->off - sVar46;
                                                  sendbuf->base[sVar27] =
                                                       (uint8_t)((ulong)lVar42 >> 8);
                                                  sendbuf->base[sVar27 + 1] = (uint8_t)lVar42;
                                                  key_schedule_extract
                                                            (tls->key_schedule,ecdh_secret);
                                                  iVar17 = setup_traffic_protection
                                                                     (tls,tls->cipher_suite,1,
                                                                                                                                            
                                                  "server handshake traffic secret");
                                                  if (iVar17 == 0) {
                                                    psVar26 = (tls->field_7).server.early_data;
                                                    if (psVar26 ==
                                                        (st_ptls_early_data_receiver_t *)0x0) {
                                                      iVar17 = setup_traffic_protection
                                                                         (tls,tls->cipher_suite,0,
                                                                                                                                                    
                                                  "client handshake traffic secret");
                                                  if (iVar17 == 0) {
                                                    if (ch.psk.early_data_indication != 0) {
                                                      paVar2 = &(tls->field_7).server;
                                                      *(byte *)paVar2 = *(byte *)paVar2 | 2;
                                                    }
                                                    goto LAB_001101ea;
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = derive_secret(tls->key_schedule,psVar26
                                                                           ,
                                                  "client handshake traffic secret");
                                                  if (iVar17 == 0) {
LAB_001101ea:
                                                    sVar46 = sendbuf->off;
                                                    iVar17 = ptls_buffer_reserve(sendbuf,3);
                                                    if (iVar17 == 0) {
                                                      puVar1 = sendbuf->base;
                                                      sVar27 = sendbuf->off;
                                                      puVar43 = puVar1 + sVar27;
                                                      puVar43[0] = '\x16';
                                                      puVar43[1] = '\x03';
                                                      puVar1[sVar27 + 2] = '\x01';
                                                      sendbuf->off = sendbuf->off + 3;
                                                      iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                      if (iVar17 == 0) {
                                                        puVar43 = sendbuf->base;
                                                        sVar27 = sendbuf->off;
                                                        (puVar43 + sVar27)[0] = '\0';
                                                        (puVar43 + sVar27)[1] = '\0';
                                                        sVar27 = sendbuf->off;
                                                        sVar48 = sVar27 + 2;
                                                        sendbuf->off = sVar48;
                                                        iVar17 = ptls_buffer_reserve(sendbuf,1);
                                                        if (iVar17 == 0) {
                                                          sendbuf->base[sendbuf->off] = '\b';
                                                          sendbuf->off = sendbuf->off + 1;
                                                          iVar17 = ptls_buffer_reserve(sendbuf,3);
                                                          if (iVar17 == 0) {
                                                            puVar43 = sendbuf->base;
                                                            sVar47 = sendbuf->off;
                                                            puVar43[sVar47 + 2] = '\0';
                                                            puVar43 = puVar43 + sVar47;
                                                            puVar43[0] = '\0';
                                                            puVar43[1] = '\0';
                                                            sVar49 = sendbuf->off;
                                                            sVar47 = sVar49 + 3;
                                                            sendbuf->off = sVar47;
                                                            iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                            if (iVar17 == 0) {
                                                              puVar43 = sendbuf->base;
                                                              sVar28 = sendbuf->off;
                                                              (puVar43 + sVar28)[0] = '\0';
                                                              (puVar43 + sVar28)[1] = '\0';
                                                              local_490 = sendbuf->off;
                                                              local_488 = local_490 + 2;
                                                              sendbuf->off = local_488;
                                                              if (tls->server_name == (char *)0x0) {
LAB_00110354:
                                                                if (((tls->field_7).server.
                                                                     early_data ==
                                                                     (st_ptls_early_data_receiver_t
                                                                      *)0x0) ||
                                                                   ((tls->traffic_protection).dec.
                                                                    aead == (ptls_aead_context_t *)
                                                                            0x0)) {
LAB_001103cc:
                                                                  lVar42 = sendbuf->off - local_488;
                                                                  sendbuf->base[local_490] =
                                                                       (uint8_t)((ulong)lVar42 >> 8)
                                                                  ;
                                                                  sendbuf->base[local_490 + 1] =
                                                                       (uint8_t)lVar42;
                                                                  sVar28 = sendbuf->off;
                                                                  lVar42 = 0x10;
                                                                  do {
                                                                    sendbuf->base[sVar49] =
                                                                         (uint8_t)(sVar28 - sVar47
                                                                                  >> ((byte)lVar42 &
                                                                                     0x3f));
                                                                    lVar42 = lVar42 + -8;
                                                                    sVar49 = sVar49 + 1;
                                                                  } while (lVar42 != -8);
                                                                  if (tls->key_schedule !=
                                                                      (st_ptls_key_schedule_t *)0x0)
                                                                  {
                                                                    psVar5 = tls->key_schedule->
                                                                             msghash;
                                                                    (*psVar5->update)(psVar5,sendbuf
                                                  ->base + sVar48,sendbuf->off - sVar48);
                                                  }
                                                  lVar42 = sendbuf->off - sVar48;
                                                  sendbuf->base[sVar27] =
                                                       (uint8_t)((ulong)lVar42 >> 8);
                                                  sendbuf->base[sVar27 + 1] = (uint8_t)lVar42;
                                                  iVar17 = buffer_encrypt_record
                                                                     (sendbuf,sVar46,
                                                                      (tls->traffic_protection).enc.
                                                                      aead);
                                                  if (iVar17 == 0) {
                                                    if (bVar12) {
                                                      sVar46 = sendbuf->off;
                                                      iVar17 = ptls_buffer_reserve(sendbuf,3);
                                                      if (iVar17 == 0) {
                                                        puVar1 = sendbuf->base;
                                                        sVar27 = sendbuf->off;
                                                        puVar43 = puVar1 + sVar27;
                                                        puVar43[0] = '\x16';
                                                        puVar43[1] = '\x03';
                                                        puVar1[sVar27 + 2] = '\x01';
                                                        sendbuf->off = sendbuf->off + 3;
                                                        iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                        if (iVar17 == 0) {
                                                          puVar43 = sendbuf->base;
                                                          sVar27 = sendbuf->off;
                                                          (puVar43 + sVar27)[0] = '\0';
                                                          (puVar43 + sVar27)[1] = '\0';
                                                          local_488 = sendbuf->off;
                                                          sVar27 = local_488 + 2;
                                                          sendbuf->off = sVar27;
                                                          iVar17 = ptls_buffer_reserve(sendbuf,1);
                                                          if (iVar17 == 0) {
                                                            sendbuf->base[sendbuf->off] = '\v';
                                                            sendbuf->off = sendbuf->off + 1;
                                                            iVar17 = ptls_buffer_reserve(sendbuf,3);
                                                            if (iVar17 == 0) {
                                                              puVar43 = sendbuf->base;
                                                              sVar48 = sendbuf->off;
                                                              puVar43[sVar48 + 2] = '\0';
                                                              puVar43 = puVar43 + sVar48;
                                                              puVar43[0] = '\0';
                                                              puVar43[1] = '\0';
                                                              local_4a0 = sendbuf->off;
                                                              local_470 = (byte *)(local_4a0 + 3);
                                                              sendbuf->off = (size_t)local_470;
                                                              iVar17 = ptls_buffer_reserve(sendbuf,1
                                                                                          );
                                                              if (iVar17 == 0) {
                                                                sendbuf->base[sendbuf->off] = '\0';
                                                                sendbuf->off = sendbuf->off + 1;
                                                                iVar17 = ptls_buffer_reserve(sendbuf
                                                  ,3);
                                                  if (iVar17 == 0) {
                                                    puVar43 = sendbuf->base;
                                                    sVar48 = sendbuf->off;
                                                    puVar43[sVar48 + 2] = '\0';
                                                    puVar43 = puVar43 + sVar48;
                                                    puVar43[0] = '\0';
                                                    puVar43[1] = '\0';
                                                    local_490 = sendbuf->off;
                                                    sVar48 = local_490 + 3;
                                                    sendbuf->off = sVar48;
                                                    local_478 = sVar48;
                                                    if (num_certs != 0) {
                                                      sVar48 = 0;
                                                      do {
                                                        iVar17 = ptls_buffer_reserve(sendbuf,3);
                                                        if (iVar17 != 0) goto LAB_0010ed47;
                                                        puVar43 = sendbuf->base;
                                                        sVar47 = sendbuf->off;
                                                        puVar43[sVar47 + 2] = '\0';
                                                        puVar43 = puVar43 + sVar47;
                                                        puVar43[0] = '\0';
                                                        puVar43[1] = '\0';
                                                        sVar49 = sendbuf->off;
                                                        sVar47 = sVar49 + 3;
                                                        sendbuf->off = sVar47;
                                                        iVar17 = ptls_buffer__do_pushv
                                                                           (sendbuf,certs[sVar48].
                                                                                    base,
                                                                            certs[sVar48].len);
                                                        if (iVar17 != 0) goto LAB_0010ed47;
                                                        sVar28 = sendbuf->off;
                                                        lVar42 = 0x10;
                                                        do {
                                                          sendbuf->base[sVar49] =
                                                               (uint8_t)(sVar28 - sVar47 >>
                                                                        ((byte)lVar42 & 0x3f));
                                                          lVar42 = lVar42 + -8;
                                                          sVar49 = sVar49 + 1;
                                                        } while (lVar42 != -8);
                                                        iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                        if (iVar17 != 0) goto LAB_0010ed47;
                                                        puVar43 = sendbuf->base;
                                                        sVar47 = sendbuf->off;
                                                        (puVar43 + sVar47)[0] = '\0';
                                                        (puVar43 + sVar47)[1] = '\0';
                                                        sVar47 = sendbuf->off;
                                                        sendbuf->off = sVar47 + 2;
                                                        sendbuf->base[sVar47] = '\0';
                                                        sendbuf->base[sVar47 + 1] = '\0';
                                                        sVar48 = sVar48 + 1;
                                                      } while (sVar48 != num_certs);
                                                      sVar48 = sendbuf->off;
                                                    }
                                                    lVar42 = 0x10;
                                                    do {
                                                      sendbuf->base[local_490] =
                                                           (uint8_t)(sVar48 - local_478 >>
                                                                    ((byte)lVar42 & 0x3f));
                                                      lVar42 = lVar42 + -8;
                                                      local_490 = local_490 + 1;
                                                    } while (lVar42 != -8);
                                                    sVar48 = sendbuf->off;
                                                    lVar42 = 0x10;
                                                    do {
                                                      sendbuf->base[local_4a0] =
                                                           (uint8_t)(sVar48 - (long)local_470 >>
                                                                    ((byte)lVar42 & 0x3f));
                                                      lVar42 = lVar42 + -8;
                                                      local_4a0 = local_4a0 + 1;
                                                    } while (lVar42 != -8);
                                                    if (tls->key_schedule !=
                                                        (st_ptls_key_schedule_t *)0x0) {
                                                      psVar5 = tls->key_schedule->msghash;
                                                      (*psVar5->update)(psVar5,sendbuf->base +
                                                                               sVar27,
                                                                        sendbuf->off - sVar27);
                                                    }
                                                    lVar42 = sendbuf->off - sVar27;
                                                    sendbuf->base[local_488] =
                                                         (uint8_t)((ulong)lVar42 >> 8);
                                                    sendbuf->base[local_488 + 1] = (uint8_t)lVar42;
                                                    iVar17 = buffer_encrypt_record
                                                                       (sendbuf,sVar46,
                                                                        (tls->traffic_protection).
                                                                        enc.aead);
                                                    if (iVar17 == 0) {
                                                      sVar46 = sendbuf->off;
                                                      iVar17 = ptls_buffer_reserve(sendbuf,3);
                                                      if (iVar17 == 0) {
                                                        puVar1 = sendbuf->base;
                                                        sVar27 = sendbuf->off;
                                                        puVar43 = puVar1 + sVar27;
                                                        puVar43[0] = '\x16';
                                                        puVar43[1] = '\x03';
                                                        puVar1[sVar27 + 2] = '\x01';
                                                        sendbuf->off = sendbuf->off + 3;
                                                        iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                        if (iVar17 == 0) {
                                                          puVar43 = sendbuf->base;
                                                          sVar27 = sendbuf->off;
                                                          (puVar43 + sVar27)[0] = '\0';
                                                          (puVar43 + sVar27)[1] = '\0';
                                                          sVar27 = sendbuf->off;
                                                          sVar48 = sVar27 + 2;
                                                          sendbuf->off = sVar48;
                                                          iVar17 = ptls_buffer_reserve(sendbuf,1);
                                                          if (iVar17 == 0) {
                                                            sendbuf->base[sendbuf->off] = '\x0f';
                                                            sendbuf->off = sendbuf->off + 1;
                                                            iVar17 = ptls_buffer_reserve(sendbuf,3);
                                                            uVar34 = sign_algorithm;
                                                            if (iVar17 == 0) {
                                                              puVar43 = sendbuf->base;
                                                              sVar47 = sendbuf->off;
                                                              puVar43[sVar47 + 2] = '\0';
                                                              puVar43 = puVar43 + sVar47;
                                                              puVar43[0] = '\0';
                                                              puVar43[1] = '\0';
                                                              sVar47 = sendbuf->off;
                                                              local_490 = sVar47 + 3;
                                                              sendbuf->off = local_490;
                                                              iVar17 = ptls_buffer_reserve(sendbuf,2
                                                                                          );
                                                              if (iVar17 == 0) {
                                                                *(uint16_t *)
                                                                 (sendbuf->base + sendbuf->off) =
                                                                     uVar34 << 8 | uVar34 >> 8;
                                                                sendbuf->off = sendbuf->off + 2;
                                                                iVar17 = ptls_buffer_reserve(sendbuf
                                                  ,2);
                                                  if (iVar17 == 0) {
                                                    puVar43 = sendbuf->base;
                                                    sVar49 = sendbuf->off;
                                                    (puVar43 + sVar49)[0] = '\0';
                                                    (puVar43 + sVar49)[1] = '\0';
                                                    sVar49 = sendbuf->off;
                                                    sendbuf->off = sVar49 + 2;
                                                    sVar28 = build_certificate_verify_signdata
                                                                       (finished_key,
                                                                        tls->key_schedule,
                                                                        context_string);
                                                    pVar55.len = sVar28;
                                                    pVar55.base = finished_key;
                                                    iVar17 = (*signer)(signer_data,sendbuf,pVar55);
                                                    if (iVar17 == 0) {
                                                      lVar42 = sendbuf->off - (sVar49 + 2);
                                                      sendbuf->base[sVar49] =
                                                           (uint8_t)((ulong)lVar42 >> 8);
                                                      sendbuf->base[sVar49 + 1] = (uint8_t)lVar42;
                                                      sVar49 = sendbuf->off;
                                                      lVar42 = 0x10;
                                                      do {
                                                        sendbuf->base[sVar47] =
                                                             (uint8_t)(sVar49 - local_490 >>
                                                                      ((byte)lVar42 & 0x3f));
                                                        lVar42 = lVar42 + -8;
                                                        sVar47 = sVar47 + 1;
                                                      } while (lVar42 != -8);
                                                      if (tls->key_schedule !=
                                                          (st_ptls_key_schedule_t *)0x0) {
                                                        psVar5 = tls->key_schedule->msghash;
                                                        (*psVar5->update)(psVar5,sendbuf->base +
                                                                                 sVar48,
                                                                          sendbuf->off - sVar48);
                                                      }
                                                      lVar42 = sendbuf->off - sVar48;
                                                      sendbuf->base[sVar27] =
                                                           (uint8_t)((ulong)lVar42 >> 8);
                                                      sendbuf->base[sVar27 + 1] = (uint8_t)lVar42;
                                                      iVar17 = buffer_encrypt_record
                                                                         (sendbuf,sVar46,
                                                                          (tls->traffic_protection).
                                                                          enc.aead);
                                                      if (iVar17 == 0) goto LAB_00110921;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
LAB_00110921:
                                                    send_finished(tls,sendbuf);
                                                    psVar25 = tls->key_schedule;
                                                    sVar46 = psVar25->algo->digest_size;
                                                    psVar25->generation = psVar25->generation + 1;
                                                    salt_04.base = psVar25->secret;
                                                    salt_04.len = sVar46;
                                                    ikm_04.len = sVar46;
                                                    ikm_04.base = zeroes_of_max_digest_size;
                                                    iVar17 = ptls_hkdf_extract(psVar25->algo,
                                                                               salt_04.base,salt_04,
                                                                               ikm_04);
                                                    if (iVar17 != 0) {
                                                      return iVar17;
                                                    }
                                                    iVar17 = setup_traffic_protection
                                                                       (tls,tls->cipher_suite,1,
                                                                                                                                                
                                                  "server application traffic secret");
                                                  if (iVar17 != 0) {
                                                    return iVar17;
                                                  }
                                                  tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
                                                  iVar17 = 0;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                    if (iVar17 == 0) {
                                                      puVar43 = sendbuf->base;
                                                      sVar28 = sendbuf->off;
                                                      (puVar43 + sVar28)[0] = '\0';
                                                      (puVar43 + sVar28)[1] = '*';
                                                      sendbuf->off = sendbuf->off + 2;
                                                      iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                      if (iVar17 == 0) {
                                                        puVar43 = sendbuf->base;
                                                        sVar28 = sendbuf->off;
                                                        (puVar43 + sVar28)[0] = '\0';
                                                        (puVar43 + sVar28)[1] = '\0';
                                                        sVar28 = sendbuf->off;
                                                        sendbuf->off = sVar28 + 2;
                                                        sendbuf->base[sVar28] = '\0';
                                                        sendbuf->base[sVar28 + 1] = '\0';
                                                        goto LAB_001103cc;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                    if (iVar17 == 0) {
                                                      puVar43 = sendbuf->base;
                                                      sVar28 = sendbuf->off;
                                                      (puVar43 + sVar28)[0] = '\0';
                                                      (puVar43 + sVar28)[1] = '\0';
                                                      sendbuf->off = sendbuf->off + 2;
                                                      iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                      if (iVar17 == 0) {
                                                        puVar43 = sendbuf->base;
                                                        sVar28 = sendbuf->off;
                                                        (puVar43 + sVar28)[0] = '\0';
                                                        (puVar43 + sVar28)[1] = '\0';
                                                        sVar28 = sendbuf->off;
                                                        sendbuf->off = sVar28 + 2;
                                                        sendbuf->base[sVar28] = '\0';
                                                        sendbuf->base[sVar28 + 1] = '\0';
                                                        goto LAB_00110354;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                                else {
                                                  iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar17 == 0) {
                                                    puVar43 = sendbuf->base;
                                                    sVar48 = sendbuf->off;
                                                    (puVar43 + sVar48)[0] = '\0';
                                                    (puVar43 + sVar48)[1] = ')';
                                                    sendbuf->off = sendbuf->off + 2;
                                                    iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                    if (iVar17 == 0) {
                                                      puVar43 = sendbuf->base;
                                                      sVar48 = sendbuf->off;
                                                      (puVar43 + sVar48)[0] = '\0';
                                                      (puVar43 + sVar48)[1] = '\0';
                                                      sVar48 = sendbuf->off;
                                                      sendbuf->off = sVar48 + 2;
                                                      iVar17 = ptls_buffer_reserve(sendbuf,2);
                                                      if (iVar17 == 0) {
                                                        *(ushort *)(sendbuf->base + sendbuf->off) =
                                                             (ushort)mess_start << 8 |
                                                             (ushort)mess_start >> 8;
                                                        sVar47 = sendbuf->off;
                                                        sendbuf->off = sVar47 + 2;
                                                        lVar42 = sVar47 - sVar48;
                                                        sendbuf->base[sVar48] =
                                                             (uint8_t)((ulong)lVar42 >> 8);
                                                        sendbuf->base[sVar48 + 1] = (uint8_t)lVar42;
                                                        goto LAB_0010fffb;
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          else {
                            psVar26 = (st_ptls_early_data_receiver_t *)malloc(0x40);
                            (tls->field_7).server.early_data = psVar26;
                            if (psVar26 == (st_ptls_early_data_receiver_t *)0x0) {
                              iVar17 = 0x201;
                            }
                            else {
                              iVar17 = setup_traffic_protection
                                                 (tls,tls->cipher_suite,0,
                                                  "client early traffic secret");
                              if (iVar17 == 0) goto LAB_0010f8eb;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
LAB_0010ed41:
        iVar17 = 0x28;
      }
    }
LAB_0010ed47:
    free(pubkey.base);
    free(ecdh_secret.base);
    psVar40 = (st_ptls_client_hello_t *)finished_key;
LAB_0010ed70:
    (*ptls_clear_memory)(psVar40,0x40);
    return iVar17;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if (uVar3 != '\x14') {
      return 0x28;
    }
    iVar17 = verify_finished(tls,message);
    if (iVar17 != 0) {
      return iVar17;
    }
    iVar17 = setup_traffic_protection(tls,tls->cipher_suite,0,"client application traffic secret");
    if (iVar17 != 0) {
      return iVar17;
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar43,uVar33);
    if (tls->ctx->ticket_lifetime != 0) {
      paVar2 = &(tls->field_7).server;
      *(byte *)paVar2 = *(byte *)paVar2 | 1;
    }
    tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
    goto LAB_0010e924;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (uVar3 != '\x04') {
      return 10;
    }
    iVar17 = decode_new_session_ticket
                       ((uint32_t *)finished_key,(uint32_t *)binder_key,(ptls_iovec_t *)&ch,
                        &max_early_data_size,puVar43 + 4,puVar43 + uVar33);
    if (iVar17 != 0) {
      return iVar17;
    }
    if (tls->ctx->save_ticket != (ptls_save_ticket_t *)0x0) {
      finished_key[0x10] = '\0';
      finished_key[0x11] = '\0';
      finished_key[0x12] = '\0';
      finished_key[0x13] = '\0';
      finished_key[0x14] = '\0';
      finished_key[0x15] = '\0';
      finished_key[0x16] = '\0';
      finished_key[0x17] = '\0';
      finished_key[8] = '\0';
      finished_key[9] = '\x02';
      finished_key[10] = '\0';
      finished_key[0xb] = '\0';
      finished_key[0xc] = '\0';
      finished_key[0xd] = '\0';
      finished_key[0xe] = '\0';
      finished_key[0xf] = '\0';
      finished_key[0x18] = '\0';
      finished_key[0x19] = '\0';
      finished_key[0x1a] = '\0';
      finished_key[0x1b] = '\0';
      finished_key._0_8_ = &ch;
      gettimeofday((timeval *)binder_key,(__timezone_ptr_t)0x0);
      iVar17 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,8);
      __ptr = (void *)finished_key._0_8_;
      sVar46 = finished_key._16_8_;
      if (iVar17 == 0) {
        uVar22 = binder_key._0_8_ * 1000 + (long)binder_key._8_8_ / 1000;
        *(ulong *)(finished_key._0_8_ + finished_key._16_8_) =
             uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
             (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
             (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 | (uVar22 & 0xff00) << 0x28 |
             uVar22 << 0x38;
        finished_key._16_8_ = finished_key._16_8_ + 8;
        uVar16 = tls->cipher_suite->id;
        iVar17 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,2);
        __ptr = (void *)finished_key._0_8_;
        sVar46 = finished_key._16_8_;
        if (iVar17 == 0) {
          *(ushort *)(finished_key._0_8_ + finished_key._16_8_) = uVar16 << 8 | uVar16 >> 8;
          finished_key._16_8_ = finished_key._16_8_ + 2;
          iVar17 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,3);
          uVar14 = finished_key._16_8_;
          __ptr = (void *)finished_key._0_8_;
          sVar46 = finished_key._16_8_;
          if (iVar17 == 0) {
            *(undefined1 *)(finished_key._0_8_ + 2 + finished_key._16_8_) = 0;
            *(undefined2 *)(finished_key._0_8_ + finished_key._16_8_) = 0;
            lVar42 = finished_key._16_8_ + 3;
            finished_key._16_8_ = lVar42;
            iVar17 = ptls_buffer__do_pushv((ptls_buffer_t *)finished_key,puVar43 + 4,uVar33 - 4);
            auVar13 = _DAT_001135a0;
            auVar11 = _DAT_00113590;
            __ptr = (void *)finished_key._0_8_;
            sVar46 = finished_key._16_8_;
            if (iVar17 == 0) {
              uVar33 = finished_key._16_8_ - lVar42;
              bVar45 = 0x10;
              lVar42 = 0;
              do {
                auVar52._8_4_ = (int)lVar42;
                auVar52._0_8_ = lVar42;
                auVar52._12_4_ = (int)((ulong)lVar42 >> 0x20);
                auVar52 = (auVar52 | auVar11) ^ auVar13;
                if (auVar52._4_4_ == -0x80000000 && auVar52._0_4_ < -0x7ffffffd) {
                  *(char *)(finished_key._0_8_ + uVar14 + lVar42) =
                       (char)(uVar33 >> (bVar45 & 0x3f));
                  *(char *)(finished_key._0_8_ + uVar14 + 1 + lVar42) =
                       (char)(uVar33 >> (bVar45 - 8 & 0x3f));
                }
                lVar42 = lVar42 + 2;
                bVar45 = bVar45 - 0x10;
              } while (lVar42 != 4);
              iVar17 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,2);
              uVar14 = finished_key._16_8_;
              __ptr = (void *)finished_key._0_8_;
              sVar46 = finished_key._16_8_;
              if (iVar17 == 0) {
                *(undefined2 *)(finished_key._0_8_ + finished_key._16_8_) = 0;
                lVar42 = finished_key._16_8_ + 2;
                finished_key._16_8_ = lVar42;
                iVar17 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,
                                             tls->key_schedule->algo->digest_size);
                sVar46 = finished_key._16_8_;
                __ptr = (void *)finished_key._0_8_;
                if ((iVar17 == 0) &&
                   (iVar17 = derive_secret(tls->key_schedule,
                                           (void *)(finished_key._0_8_ + finished_key._16_8_),
                                           "resumption master secret"), iVar17 == 0)) {
                  sVar46 = sVar46 + tls->key_schedule->algo->digest_size;
                  uVar16 = (short)sVar46 - (short)lVar42;
                  *(ushort *)((long)__ptr + uVar14) = uVar16 * 0x100 | uVar16 >> 8;
                  psVar8 = tls->ctx->save_ticket;
                  pVar54.len = sVar46;
                  pVar54.base = (uint8_t *)__ptr;
                  iVar17 = (*psVar8->cb)(psVar8,tls,pVar54);
                }
              }
            }
          }
        }
      }
      (*ptls_clear_memory)(__ptr,sVar46);
      if (finished_key._24_4_ != 0) {
        free(__ptr);
        return iVar17;
      }
      return iVar17;
    }
LAB_0010e924:
    aVar50 = PTLS_STATE_CLIENT_HANDSHAKE_START;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    goto switchD_0010e1ab_caseD_a;
  }
LAB_0010ed31:
  aVar50 = 0x202;
switchD_0010e1ab_caseD_a:
  return aVar50;
}

Assistant:

static int handle_handshake_message(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_iovec_t message,
                                    ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO) {
            ret = client_handle_hello(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = client_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED) {
            ret = client_handle_finished(tls, sendbuf, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO) {
            ret = server_handle_hello(tls, sendbuf, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        break;
    default:
        assert(!"unexpected state");
        break;
    }

    return ret;
}